

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_10,_12>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  Vector<float,_4> *pVVar1;
  float *pfVar2;
  Vector<float,_3> *pVVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  Vector<float,_3> *pVVar7;
  long lVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat4x3 m;
  Type in0;
  float afStack_130 [6];
  float local_118 [4];
  float local_108 [2];
  ulong local_100;
  undefined4 local_f8;
  float local_f0 [4];
  float local_e0 [4];
  float local_d0 [6];
  Matrix<float,_3,_4> local_b8;
  Matrix<float,_4,_3> local_88;
  Matrix<float,_4,_4> local_50;
  long lVar10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pVVar1 = local_88.m_data.m_data + 1;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar8 = 0;
      auVar9 = _DAT_019fcc00;
      do {
        bVar11 = SUB164(auVar9 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar4 != lVar8) {
            uVar12 = 0;
          }
          *(undefined4 *)
           ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar1 + -1))->m_data[0].m_data + lVar8) =
               uVar12;
        }
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar4 + -0x10 != lVar8) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)pVVar1->m_data + lVar8) = uVar12;
        }
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x40);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x10;
      pVVar1 = (Vector<float,_4> *)(pVVar1->m_data + 1);
    } while (lVar6 != 4);
    local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_88.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_88.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_88.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_88.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_88.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    pfVar2 = (float *)&local_88;
    local_88.m_data.m_data[2].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[1] = 0.0;
    local_88.m_data.m_data[2].m_data[2] = 0.0;
    local_88.m_data.m_data[2].m_data[3] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[2] = 0.0;
    local_88.m_data.m_data[1].m_data[3] = 0.0;
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[2] = 0.0;
    local_88.m_data.m_data[0].m_data[3] = 0.0;
    puVar5 = &s_constInMat3x4;
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        pfVar2[lVar6] = (float)*(undefined4 *)((long)puVar5 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      lVar4 = lVar4 + 1;
      pfVar2 = pfVar2 + 1;
      puVar5 = puVar5 + 3;
    } while (lVar4 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar2 = (float *)&local_b8;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar8 = 0;
      do {
        uVar12 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar8) = uVar12;
        lVar8 = lVar8 + 0xc;
      } while (lVar8 != 0x30);
      lVar6 = lVar6 + 1;
      pfVar2 = pfVar2 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar6 != 3);
    local_b8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_b8.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_b8.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_b8.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_b8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_b8.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 1);
    local_b8.m_data.m_data[3].m_data[0] = evalCtx->in[3].m_data[0];
    local_b8.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    pVVar3 = (Vector<float,_3> *)&local_b8;
    local_b8.m_data.m_data[2].m_data[2] = 0.0;
    local_b8.m_data.m_data[3].m_data[0] = 0.0;
    local_b8.m_data.m_data[3].m_data[1] = 0.0;
    local_b8.m_data.m_data[3].m_data[2] = 0.0;
    local_b8.m_data.m_data[1].m_data[1] = 0.0;
    local_b8.m_data.m_data[1].m_data[2] = 0.0;
    local_b8.m_data.m_data[2].m_data[0] = 0.0;
    local_b8.m_data.m_data[2].m_data[1] = 0.0;
    local_b8.m_data.m_data[0].m_data[0] = 0.0;
    local_b8.m_data.m_data[0].m_data[1] = 0.0;
    local_b8.m_data.m_data[0].m_data[2] = 0.0;
    local_b8.m_data.m_data[1].m_data[0] = 0.0;
    puVar5 = &DAT_01bf4660;
    lVar4 = 0;
    do {
      lVar6 = 0;
      pVVar7 = pVVar3;
      do {
        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar7->m_data)->m_data[0].m_data[0] =
             (float)puVar5[lVar6];
        lVar6 = lVar6 + 1;
        pVVar7 = pVVar7 + 1;
      } while (lVar6 != 4);
      lVar4 = lVar4 + 1;
      pVVar3 = (Vector<float,_3> *)(pVVar3->m_data + 1);
      puVar5 = puVar5 + 4;
    } while (lVar4 != 3);
  }
  afStack_130[0] = 2.5450046e-38;
  afStack_130[1] = 0.0;
  tcu::operator*(&local_50,&local_88,&local_b8);
  local_d0[0] = local_50.m_data.m_data[0].m_data[0];
  local_d0[1] = local_50.m_data.m_data[0].m_data[1];
  local_d0[2] = local_50.m_data.m_data[0].m_data[2];
  local_e0[0] = local_50.m_data.m_data[1].m_data[1];
  local_e0[1] = local_50.m_data.m_data[1].m_data[2];
  local_e0[2] = local_50.m_data.m_data[1].m_data[3];
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  lVar4 = 0;
  do {
    local_118[lVar4] = local_d0[lVar4] + local_e0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_f0[0] = local_50.m_data.m_data[2].m_data[2];
  local_f0[1] = local_50.m_data.m_data[2].m_data[3];
  local_f0[2] = local_50.m_data.m_data[2].m_data[0];
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_100 = local_100 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    local_108[lVar4] = local_118[lVar4] + local_f0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d0[3] = local_50.m_data.m_data[3].m_data[3];
  local_d0[4] = local_50.m_data.m_data[3].m_data[0];
  local_d0[5] = local_50.m_data.m_data[3].m_data[1];
  afStack_130[2] = 0.0;
  afStack_130[3] = 0.0;
  afStack_130[4] = 0.0;
  lVar4 = 0;
  do {
    afStack_130[lVar4 + 2] = local_108[lVar4] + local_d0[lVar4 + 3];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_100 = 0x100000000;
  local_f8 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_108[lVar4]] = afStack_130[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}